

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::DefaultNullOrderSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  int iVar1;
  ParserException *this;
  DefaultOrderByNullType DVar2;
  string parameter;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Value::ToString_abi_cxx11_(&local_68,input);
  StringUtil::Lower(&local_88,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
  DVar2 = NULLS_FIRST;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
        if (iVar1 != 0) {
          iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
          DVar2 = NULLS_LAST;
          if (iVar1 != 0) {
            iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
            if (iVar1 != 0) {
              iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
              if (iVar1 != 0) {
                iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                if (iVar1 != 0) {
                  iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                  DVar2 = NULLS_FIRST_ON_ASC_LAST_ON_DESC;
                  if (iVar1 != 0) {
                    iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                    if (iVar1 != 0) {
                      iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                      if (iVar1 != 0) {
                        iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                        DVar2 = NULLS_LAST_ON_ASC_FIRST_ON_DESC;
                        if (iVar1 != 0) {
                          iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
                          if (iVar1 != 0) {
                            this = (ParserException *)__cxa_allocate_exception(0x10);
                            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_68,
                                       "Unrecognized parameter for option NULL_ORDER \"%s\", expected either NULLS FIRST, NULLS LAST, SQLite, MySQL or Postgres"
                                       ,"");
                            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_48,local_88._M_dataplus._M_p,
                                       local_88._M_dataplus._M_p + local_88._M_string_length);
                            ParserException::ParserException<std::__cxx11::string>
                                      (this,&local_68,&local_48);
                            __cxa_throw(this,&ParserException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (config->options).default_null_order = DVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DefaultNullOrderSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());

	if (parameter == "nulls_first" || parameter == "nulls first" || parameter == "null first" || parameter == "first") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_FIRST;
	} else if (parameter == "nulls_last" || parameter == "nulls last" || parameter == "null last" ||
	           parameter == "last") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_LAST;
	} else if (parameter == "nulls_first_on_asc_last_on_desc" || parameter == "sqlite" || parameter == "mysql") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_FIRST_ON_ASC_LAST_ON_DESC;
	} else if (parameter == "nulls_last_on_asc_first_on_desc" || parameter == "postgres") {
		config.options.default_null_order = DefaultOrderByNullType::NULLS_LAST_ON_ASC_FIRST_ON_DESC;
	} else {
		throw ParserException("Unrecognized parameter for option NULL_ORDER \"%s\", expected either NULLS FIRST, NULLS "
		                      "LAST, SQLite, MySQL or Postgres",
		                      parameter);
	}
}